

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void sortSetData(HighsInt num_entries,vector<int,_std::allocator<int>_> *set,HighsVarType *data0,
                HighsVarType *sorted_data0)

{
  size_type __n;
  int *piVar1;
  int *piVar2;
  reference pvVar3;
  long in_RCX;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  HighsInt ix_1;
  HighsInt ix;
  HighsInt *perm;
  HighsInt *sort_set;
  vector<int,_std::allocator<int>_> perm_vec;
  vector<int,_std::allocator<int>_> sort_set_vec;
  HighsInt *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar4;
  allocator_type *in_stack_ffffffffffffff60;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *this;
  int local_88;
  int local_84;
  allocator_type local_69 [48];
  vector<int,_std::allocator<int>_> local_39;
  long local_20;
  long local_18;
  vector<int,_std::allocator<int>_> *local_10;
  int local_4;
  
  if (0 < in_EDI) {
    __n = (size_type)(in_EDI + 1);
    this = &local_39;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_4 = in_EDI;
    std::allocator<int>::allocator((allocator<int> *)0x7e5934);
    std::vector<int,_std::allocator<int>_>::vector(this,__n,in_stack_ffffffffffffff60);
    std::allocator<int>::~allocator((allocator<int> *)0x7e5957);
    __a = local_69;
    std::allocator<int>::allocator((allocator<int> *)0x7e5976);
    std::vector<int,_std::allocator<int>_>::vector(this,__n,__a);
    std::allocator<int>::~allocator((allocator<int> *)0x7e5996);
    piVar1 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7e59a3);
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7e59b2);
    for (local_84 = 0; local_84 < local_4; local_84 = local_84 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_84);
      piVar1[local_84 + 1] = *pvVar3;
      piVar2[local_84 + 1] = local_84;
    }
    maxheapsort((HighsInt *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                in_stack_ffffffffffffff48,0);
    for (local_88 = 0; local_88 < local_4; local_88 = local_88 + 1) {
      iVar4 = piVar1[local_88 + 1];
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_88);
      *pvVar3 = iVar4;
      if (local_18 != 0) {
        *(undefined1 *)(local_20 + local_88) = *(undefined1 *)(local_18 + piVar2[local_88 + 1]);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  }
  return;
}

Assistant:

void sortSetData(const HighsInt num_entries, vector<HighsInt>& set,
                 const HighsVarType* data0, HighsVarType* sorted_data0) {
  if (num_entries <= 0) return;
  vector<HighsInt> sort_set_vec(1 + num_entries);
  vector<HighsInt> perm_vec(1 + num_entries);

  HighsInt* sort_set = sort_set_vec.data();
  HighsInt* perm = perm_vec.data();

  for (HighsInt ix = 0; ix < num_entries; ix++) {
    sort_set[1 + ix] = set[ix];
    perm[1 + ix] = ix;
  }
  maxheapsort(sort_set, perm, num_entries);
  for (HighsInt ix = 0; ix < num_entries; ix++) {
    set[ix] = sort_set[1 + ix];
    if (data0 != NULL) sorted_data0[ix] = data0[perm[1 + ix]];
  }
}